

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void __thiscall
gl4cts::GLSL420Pack::BindingUniformBlocksTest::prepareUniforms
          (BindingUniformBlocksTest *this,program *program)

{
  buffer *this_00;
  buffer *this_01;
  buffer *this_02;
  
  this_00 = &this->m_goku_buffer;
  Utils::buffer::generate(this_00,0x8a11);
  this_01 = &this->m_vegeta_buffer;
  Utils::buffer::generate(this_01,0x8a11);
  this_02 = &this->m_children_buffer;
  Utils::buffer::generate(this_02,0x8a11);
  Utils::buffer::update(this_00,0x10,prepareUniforms::goku_data,0x88e4);
  Utils::buffer::update(this_01,0xc,prepareUniforms::vegeta_data,0x88e4);
  Utils::buffer::update(this_02,0x20,prepareUniforms::children_data,0x88e4);
  Utils::buffer::bindRange(this_00,0,0,0x10);
  Utils::buffer::bindRange(this_01,1,0,0xc);
  Utils::buffer::bindRange(this_02,3,0,0x20);
  return;
}

Assistant:

void BindingUniformBlocksTest::prepareUniforms(Utils::program& program)
{
	(void)program;
	static const GLfloat goku_data[4]	 = { 1.0f, 0.0f, 0.0f, 0.0f };
	static const GLfloat vegeta_data[3]   = { 0.0f, 1.0f, 0.0f };
	static const GLfloat children_data[8] = { 0.0f, 0.0f, 1.0f, 0.0f, 0.0f, 0.0f, 0.0f, 1.0f };

	m_goku_buffer.generate(GL_UNIFORM_BUFFER);
	m_vegeta_buffer.generate(GL_UNIFORM_BUFFER);
	m_children_buffer.generate(GL_UNIFORM_BUFFER);

	m_goku_buffer.update(sizeof(goku_data), (GLvoid*)goku_data, GL_STATIC_DRAW);
	m_vegeta_buffer.update(sizeof(vegeta_data), (GLvoid*)vegeta_data, GL_STATIC_DRAW);
	m_children_buffer.update(sizeof(children_data), (GLvoid*)children_data, GL_STATIC_DRAW);

	m_goku_buffer.bindRange(0 /* index */, 0 /* offset */, sizeof(goku_data));
	m_vegeta_buffer.bindRange(1 /* index */, 0 /* offset */, sizeof(vegeta_data));
	m_children_buffer.bindRange(3 /* index */, 0 /* offset */, sizeof(children_data));
}